

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall
FfsParser::parseVolumeNonUefiData
          (FfsParser *this,UByteArray *data,UINT32 localOffset,UModelIndex *index)

{
  TreeModel *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  CBString local_f8;
  UByteArray local_e0;
  UByteArray local_c0;
  CBString local_a0;
  CBString local_78;
  undefined1 local_60 [8];
  UModelIndex paddingIndex;
  CBString info;
  UModelIndex *index_local;
  UINT32 localOffset_local;
  UByteArray *data_local;
  FfsParser *this_local;
  
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    uVar2 = UByteArray::size(data);
    uVar3 = UByteArray::size(data);
    usprintf((CBString *)&paddingIndex.m,"Full size: %Xh (%u)",(ulong)uVar2,(ulong)uVar3);
    this_00 = this->model;
    Bstrlib::CBString::CBString(&local_78,"Non-UEFI data");
    Bstrlib::CBString::CBString(&local_a0);
    UByteArray::UByteArray(&local_c0);
    UByteArray::UByteArray(&local_e0);
    TreeModel::addItem((UModelIndex *)local_60,this_00,localOffset,'@','z',&local_78,&local_a0,
                       (CBString *)&paddingIndex.m,&local_c0,data,&local_e0,Fixed,index,'\0');
    UByteArray::~UByteArray(&local_e0);
    UByteArray::~UByteArray(&local_c0);
    Bstrlib::CBString::~CBString(&local_a0);
    Bstrlib::CBString::~CBString(&local_78);
    usprintf(&local_f8,"%s: non-UEFI data found in volume\'s free space","parseVolumeNonUefiData");
    msg(this,&local_f8,(UModelIndex *)local_60);
    Bstrlib::CBString::~CBString(&local_f8);
    this_local = (FfsParser *)parseRawArea(this,(UModelIndex *)local_60);
    Bstrlib::CBString::~CBString((CBString *)&paddingIndex.m);
  }
  else {
    this_local = (FfsParser *)0x1;
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseVolumeNonUefiData(const UByteArray & data, const UINT32 localOffset, const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Get info
    UString info = usprintf("Full size: %Xh (%u)", (UINT32)data.size(), (UINT32)data.size());
    
    // Add padding tree item
    UModelIndex paddingIndex = model->addItem(localOffset, Types::Padding, Subtypes::DataPadding, UString("Non-UEFI data"), UString(), info, UByteArray(), data, UByteArray(), Fixed, index);
    msg(usprintf("%s: non-UEFI data found in volume's free space", __FUNCTION__), paddingIndex);
    
    // Parse contents as RAW area
    return parseRawArea(paddingIndex);
}